

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISpriteBank.cpp
# Opt level: O0

void __thiscall
irr::gui::CGUISpriteBank::draw2DSpriteBatch
          (CGUISpriteBank *this,array<unsigned_int> *indices,array<irr::core::vector2d<int>_> *pos,
          rect<int> *clip,SColor *color,u32 starttime,u32 currenttime,bool loop,bool center)

{
  bool bVar1;
  int iVar2;
  u32 uVar3;
  uint *puVar4;
  SGUISpriteFrame *pSVar5;
  vector2d<int> *pvVar6;
  undefined8 uVar7;
  SDrawBatch *pSVar8;
  SDrawBatch *pSVar9;
  CGUISpriteBank *in_RCX;
  long *in_RDI;
  undefined4 *in_R8;
  byte in_stack_00000010;
  byte in_stack_00000018;
  u32 i_2;
  position2di p;
  rect<int> *r;
  u32 rn;
  SDrawBatch *currentBatch;
  u32 texNum;
  u32 frame;
  u32 index;
  u32 i_1;
  u32 i;
  array<irr::gui::CGUISpriteBank::SDrawBatch> drawBatches;
  u32 drawCount;
  undefined4 in_stack_fffffffffffffe98;
  u32 in_stack_fffffffffffffe9c;
  SDrawBatch *in_stack_fffffffffffffea0;
  rect<int> *in_stack_fffffffffffffea8;
  array<irr::core::rect<int>_> *in_stack_fffffffffffffeb0;
  SDrawBatch *in_stack_fffffffffffffec0;
  u32 in_stack_fffffffffffffec8;
  u32 in_stack_fffffffffffffecc;
  u32 in_stack_fffffffffffffed0;
  uint uVar10;
  uint local_100;
  dimension2d<int> local_f0;
  vector2d<int> local_e8;
  rect<int> *local_e0;
  u32 local_d4;
  SDrawBatch *local_d0;
  u32 local_c4;
  undefined4 local_c0;
  undefined4 local_bc;
  uint local_b8;
  uint local_b4;
  undefined1 local_b0 [76];
  uint local_64;
  u32 local_3c;
  u32 local_38;
  uint local_34;
  byte local_2e;
  byte local_2d;
  undefined4 *local_28;
  CGUISpriteBank *local_20;
  
  local_2d = in_stack_00000010 & 1;
  local_2e = in_stack_00000018 & 1;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_38 = core::array<unsigned_int>::size((array<unsigned_int> *)0x3d4601);
  local_3c = core::array<irr::core::vector2d<int>_>::size
                       ((array<irr::core::vector2d<int>_> *)0x3d4615);
  puVar4 = core::min_<unsigned_int>(&local_38,&local_3c);
  local_34 = *puVar4;
  iVar2 = (**(code **)(*in_RDI + 0x10))();
  if (iVar2 != 0) {
    (**(code **)(*in_RDI + 0x10))();
    core::array<irr::gui::CGUISpriteBank::SDrawBatch>::array
              ((array<irr::gui::CGUISpriteBank::SDrawBatch> *)in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe9c);
    local_64 = 0;
    while (uVar10 = local_64,
          uVar3 = core::array<irr::video::ITexture_*>::size
                            ((array<irr::video::ITexture_*> *)0x3d468d), uVar10 < uVar3) {
      memset(local_b0,0,0x48);
      SDrawBatch::SDrawBatch(in_stack_fffffffffffffea0);
      core::array<irr::gui::CGUISpriteBank::SDrawBatch>::push_back
                ((array<irr::gui::CGUISpriteBank::SDrawBatch> *)in_stack_fffffffffffffea0,
                 (SDrawBatch *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      SDrawBatch::~SDrawBatch(in_stack_fffffffffffffea0);
      core::array<irr::gui::CGUISpriteBank::SDrawBatch>::operator[]
                ((array<irr::gui::CGUISpriteBank::SDrawBatch> *)in_stack_fffffffffffffea0,
                 in_stack_fffffffffffffe9c);
      core::array<irr::core::vector2d<int>_>::reallocate
                ((array<irr::core::vector2d<int>_> *)in_stack_fffffffffffffeb0,
                 (u32)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffea8 >> 0x18,0));
      core::array<irr::gui::CGUISpriteBank::SDrawBatch>::operator[]
                ((array<irr::gui::CGUISpriteBank::SDrawBatch> *)in_stack_fffffffffffffea0,
                 in_stack_fffffffffffffe9c);
      core::array<irr::core::rect<int>_>::reallocate
                (in_stack_fffffffffffffeb0,(u32)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffea8 >> 0x18,0));
      local_64 = local_64 + 1;
    }
    for (local_b4 = 0; local_b4 < local_34; local_b4 = local_b4 + 1) {
      puVar4 = core::array<unsigned_int>::operator[]
                         ((array<unsigned_int> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c
                         );
      local_b8 = *puVar4;
      local_bc = 0;
      bVar1 = getFrameNr(in_RCX,(u32 *)CONCAT44(uVar10,in_stack_fffffffffffffed0),
                         in_stack_fffffffffffffecc,in_stack_fffffffffffffec8,
                         SUB81((ulong)in_stack_fffffffffffffec0 >> 0x38,0));
      if (!bVar1) {
        local_c0 = 1;
        goto LAB_003d4ad4;
      }
      core::array<irr::gui::SGUISprite>::operator[]
                ((array<irr::gui::SGUISprite> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c)
      ;
      pSVar5 = core::array<irr::gui::SGUISpriteFrame>::operator[]
                         ((array<irr::gui::SGUISpriteFrame> *)in_stack_fffffffffffffea0,
                          in_stack_fffffffffffffe9c);
      in_stack_fffffffffffffed0 = pSVar5->textureNumber;
      local_c4 = in_stack_fffffffffffffed0;
      uVar3 = core::array<irr::gui::CGUISpriteBank::SDrawBatch>::size
                        ((array<irr::gui::CGUISpriteBank::SDrawBatch> *)0x3d481c);
      if (in_stack_fffffffffffffed0 < uVar3) {
        local_d0 = core::array<irr::gui::CGUISpriteBank::SDrawBatch>::operator[]
                             ((array<irr::gui::CGUISpriteBank::SDrawBatch> *)
                              in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
        core::array<irr::gui::SGUISprite>::operator[]
                  ((array<irr::gui::SGUISprite> *)in_stack_fffffffffffffea0,
                   in_stack_fffffffffffffe9c);
        pSVar5 = core::array<irr::gui::SGUISpriteFrame>::operator[]
                           ((array<irr::gui::SGUISpriteFrame> *)in_stack_fffffffffffffea0,
                            in_stack_fffffffffffffe9c);
        in_stack_fffffffffffffecc = pSVar5->rectNumber;
        local_d4 = in_stack_fffffffffffffecc;
        uVar3 = core::array<irr::core::rect<int>_>::size((array<irr::core::rect<int>_> *)0x3d488e);
        if (uVar3 <= in_stack_fffffffffffffecc) {
          local_c0 = 1;
          goto LAB_003d4ad4;
        }
        local_e0 = core::array<irr::core::rect<int>_>::operator[]
                             ((array<irr::core::rect<int>_> *)in_stack_fffffffffffffea0,
                              in_stack_fffffffffffffe9c);
        if ((local_2e & 1) == 0) {
          in_stack_fffffffffffffec0 = local_d0;
          core::array<irr::core::vector2d<int>_>::operator[]
                    (&in_stack_fffffffffffffea0->positions,in_stack_fffffffffffffe9c);
          core::array<irr::core::vector2d<int>_>::push_back
                    (&in_stack_fffffffffffffea0->positions,
                     (vector2d<int> *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98))
          ;
          core::array<irr::core::rect<int>_>::push_back
                    ((array<irr::core::rect<int>_> *)in_stack_fffffffffffffea0,
                     (rect<int> *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        }
        else {
          pvVar6 = core::array<irr::core::vector2d<int>_>::operator[]
                             (&in_stack_fffffffffffffea0->positions,in_stack_fffffffffffffe9c);
          local_e8 = *pvVar6;
          core::rect<int>::getSize(in_stack_fffffffffffffea8);
          local_f0 = core::dimension2d<int>::operator/
                               ((dimension2d<int> *)in_stack_fffffffffffffea8,
                                (int *)in_stack_fffffffffffffea0);
          core::vector2d<int>::operator-=(&local_e8,&local_f0);
          core::array<irr::core::vector2d<int>_>::push_back
                    (&in_stack_fffffffffffffea0->positions,
                     (vector2d<int> *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98))
          ;
          core::array<irr::core::rect<int>_>::push_back
                    ((array<irr::core::rect<int>_> *)in_stack_fffffffffffffea0,
                     (rect<int> *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        }
      }
    }
    for (local_100 = 0;
        uVar3 = core::array<irr::gui::CGUISpriteBank::SDrawBatch>::size
                          ((array<irr::gui::CGUISpriteBank::SDrawBatch> *)0x3d49de),
        local_100 < uVar3; local_100 = local_100 + 1) {
      core::array<irr::gui::CGUISpriteBank::SDrawBatch>::operator[]
                ((array<irr::gui::CGUISpriteBank::SDrawBatch> *)in_stack_fffffffffffffea0,
                 in_stack_fffffffffffffe9c);
      bVar1 = core::array<irr::core::vector2d<int>_>::empty
                        ((array<irr::core::vector2d<int>_> *)0x3d4a05);
      if (!bVar1) {
        core::array<irr::gui::CGUISpriteBank::SDrawBatch>::operator[]
                  ((array<irr::gui::CGUISpriteBank::SDrawBatch> *)in_stack_fffffffffffffea0,
                   in_stack_fffffffffffffe9c);
        bVar1 = core::array<irr::core::rect<int>_>::empty((array<irr::core::rect<int>_> *)0x3d4a2a);
        if (!bVar1) {
          in_stack_fffffffffffffea0 = (SDrawBatch *)in_RDI[0xe];
          uVar7 = (**(code **)(*in_RDI + 0x18))(in_RDI,local_100);
          pSVar8 = core::array<irr::gui::CGUISpriteBank::SDrawBatch>::operator[]
                             ((array<irr::gui::CGUISpriteBank::SDrawBatch> *)
                              in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
          pSVar9 = core::array<irr::gui::CGUISpriteBank::SDrawBatch>::operator[]
                             ((array<irr::gui::CGUISpriteBank::SDrawBatch> *)
                              in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
          (**(code **)&(((_Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
                          *)&(in_stack_fffffffffffffea0->positions).m_data)->_M_impl).
                       super__Vector_impl_data._M_start[5].sourceRects.m_data.
                       super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>
          )(in_stack_fffffffffffffea0,uVar7,pSVar8,&pSVar9->sourceRects,local_20,*local_28,1);
        }
      }
    }
    local_c0 = 0;
LAB_003d4ad4:
    core::array<irr::gui::CGUISpriteBank::SDrawBatch>::~array
              ((array<irr::gui::CGUISpriteBank::SDrawBatch> *)0x3d4ae1);
  }
  return;
}

Assistant:

void CGUISpriteBank::draw2DSpriteBatch(const core::array<u32> &indices,
		const core::array<core::position2di> &pos,
		const core::rect<s32> *clip,
		const video::SColor &color,
		u32 starttime, u32 currenttime,
		bool loop, bool center)
{
	const irr::u32 drawCount = core::min_<u32>(indices.size(), pos.size());

	if (!getTextureCount())
		return;
	core::array<SDrawBatch> drawBatches(getTextureCount());
	for (u32 i = 0; i < Textures.size(); ++i) {
		drawBatches.push_back(SDrawBatch());
		drawBatches[i].positions.reallocate(drawCount);
		drawBatches[i].sourceRects.reallocate(drawCount);
	}

	for (u32 i = 0; i < drawCount; ++i) {
		const u32 index = indices[i];

		// work out frame number
		u32 frame = 0;
		if (!getFrameNr(frame, index, currenttime - starttime, loop))
			return;

		const u32 texNum = Sprites[index].Frames[frame].textureNumber;
		if (texNum >= drawBatches.size()) {
			continue;
		}
		SDrawBatch &currentBatch = drawBatches[texNum];

		const u32 rn = Sprites[index].Frames[frame].rectNumber;
		if (rn >= Rectangles.size())
			return;

		const core::rect<s32> &r = Rectangles[rn];

		if (center) {
			core::position2di p = pos[i];
			p -= r.getSize() / 2;

			currentBatch.positions.push_back(p);
			currentBatch.sourceRects.push_back(r);
		} else {
			currentBatch.positions.push_back(pos[i]);
			currentBatch.sourceRects.push_back(r);
		}
	}

	for (u32 i = 0; i < drawBatches.size(); i++) {
		if (!drawBatches[i].positions.empty() && !drawBatches[i].sourceRects.empty())
			Driver->draw2DImageBatch(getTexture(i), drawBatches[i].positions,
					drawBatches[i].sourceRects, clip, color, true);
	}
}